

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLast
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this)

{
  int iVar1;
  Node *pNVar2;
  Node *next;
  Node *pNStack_18;
  int level;
  Node *x;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this_local;
  
  pNVar2 = this->head_;
  iVar1 = GetMaxHeight(this);
  next._4_4_ = iVar1 + -1;
  while( true ) {
    do {
      pNStack_18 = pNVar2;
      pNVar2 = Node::Next(pNStack_18,next._4_4_);
    } while (pNVar2 != (Node *)0x0);
    if (next._4_4_ == 0) break;
    next._4_4_ = next._4_4_ + -1;
    pNVar2 = pNStack_18;
  }
  return pNStack_18;
}

Assistant:

typename SkipList<Key, Comparator>::Node* SkipList<Key, Comparator>::FindLast()
    const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (next == nullptr) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}